

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcscan.c
# Opt level: O0

int gcscan1(int probe)

{
  uint uVar1;
  int contents;
  htlinkptr *htlptr;
  int probe_local;
  
  htlptr._0_4_ = probe;
  while( true ) {
    do {
      htlptr._0_4_ = (int)htlptr + -1;
      if ((int)htlptr < 0) {
        return -1;
      }
      uVar1 = HTmain[(int)htlptr];
    } while (uVar1 == 0);
    if ((HTmain[(int)htlptr] & 1) != 0) break;
    if ((int)uVar1 >> 0x10 == 0) {
      return (int)htlptr;
    }
  }
  return (int)htlptr;
}

Assistant:

int gcscan1(int probe)
/* probe is offset */
{
  struct htlinkptr *htlptr; /* overlay access method */
  int contents;
  while (--probe >= 0) /* End of HTmain Table ? */
  {
    /* Start addr. of scanning */
    htlptr = (struct htlinkptr *)(HTmain + probe);
    contents = ((struct htlinkptr *)GCPTR(htlptr))->contents;
    if (contents && (((struct hashentry *)GCPTR(HTENDS))->collision || (GetStkCnt(contents) == 0)))
      return (probe);
  }
  return (-1);
}